

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O3

FxExpression * __thiscall
FxIdentifier::ResolveMember
          (FxIdentifier *this,FCompileContext *ctx,PStruct *classctx,FxExpression **object,
          PStruct *objtype)

{
  PClass *pPVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *plVar5;
  FxExpression *pFVar6;
  PSymbol *sym;
  PClass *pPVar7;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined8 *puVar8;
  undefined **ppuVar9;
  PClass *pPVar10;
  char *message;
  char *pcVar11;
  FScriptPosition *this_00;
  bool bVar12;
  bool bVar13;
  PSymbolTable *symtbl;
  PSymbolTable *local_40;
  FName local_34;
  PClass *pPVar4;
  undefined4 extraout_var_01;
  
  pPVar7 = PClass::RegistrationInfo.MyClass;
  pPVar4 = (objtype->super_PNamedType).super_PCompoundType.super_PType.super_PTypeBase.super_DObject
           .Class;
  if (pPVar4 == (PClass *)0x0) {
    iVar2 = (**(objtype->super_PNamedType).super_PCompoundType.super_PType.super_PTypeBase.
               super_DObject._vptr_DObject)(objtype);
    pPVar4 = (PClass *)CONCAT44(extraout_var,iVar2);
    (objtype->super_PNamedType).super_PCompoundType.super_PType.super_PTypeBase.super_DObject.Class
         = pPVar4;
  }
  pPVar1 = PClassActor::RegistrationInfo.MyClass;
  bVar12 = pPVar4 != (PClass *)0x0;
  pPVar10 = pPVar4;
  if (pPVar4 != pPVar7 && bVar12) {
    do {
      pPVar10 = pPVar10->ParentClass;
      bVar12 = pPVar10 != (PClass *)0x0;
      if (pPVar10 == pPVar7) break;
    } while (pPVar10 != (PClass *)0x0);
  }
  local_34.Index = (this->Identifier).Index;
  if (local_34.Index == 0x249) {
    if (pPVar4 == (PClass *)0x0) {
      iVar2 = (**(objtype->super_PNamedType).super_PCompoundType.super_PType.super_PTypeBase.
                 super_DObject._vptr_DObject)(objtype);
      pPVar4 = (PClass *)CONCAT44(extraout_var_00,iVar2);
      (objtype->super_PNamedType).super_PCompoundType.super_PType.super_PTypeBase.super_DObject.
      Class = pPVar4;
    }
    bVar12 = pPVar4 != (PClass *)0x0;
    if (pPVar4 != pPVar1 && bVar12) {
      do {
        pPVar4 = pPVar4->ParentClass;
        bVar12 = pPVar4 != (PClass *)0x0;
        if (pPVar4 == pPVar1) break;
      } while (pPVar4 != (PClass *)0x0);
    }
    if (!bVar12) {
      FScriptPosition::Message
                (&(this->super_FxExpression).ScriptPosition,2,"\'Default\' requires an actor type.")
      ;
      (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
      return (FxExpression *)0x0;
    }
    plVar5 = (long *)FMemArena::Alloc(&FxAlloc,0x38);
    pFVar6 = *object;
    *plVar5 = (long)&PTR__FxExpression_0070d370;
    FScriptPosition::FScriptPosition
              ((FScriptPosition *)(plVar5 + 1),&(this->super_FxExpression).ScriptPosition);
    plVar5[3] = 0;
    *(undefined2 *)(plVar5 + 4) = 0x100;
    *(undefined4 *)((long)plVar5 + 0x24) = 3;
    *plVar5 = (long)&PTR__FxClassDefaults_0070c790;
    plVar5[5] = (long)pFVar6;
    *(undefined1 *)(plVar5 + 6) = 0;
    *object = (FxExpression *)0x0;
    (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
    pFVar6 = (FxExpression *)(**(code **)(*plVar5 + 0x10))(plVar5,ctx);
    return pFVar6;
  }
  sym = PSymbolTable::FindSymbolInTable
                  (&(objtype->super_PNamedType).super_PCompoundType.super_PType.Symbols,&local_34,
                   &local_40);
  pPVar4 = PSymbolConst::RegistrationInfo.MyClass;
  if (sym == (PSymbol *)0x0) {
    pcVar11 = FName::NameData.NameArray[(this->Identifier).Index].Text;
    message = "Unknown identifier \'%s\'";
  }
  else {
    pPVar7 = (sym->super_PTypeBase).super_DObject.Class;
    if (pPVar7 == (PClass *)0x0) {
      iVar2 = (**(sym->super_PTypeBase).super_DObject._vptr_DObject)(sym);
      pPVar7 = (PClass *)CONCAT44(extraout_var_01,iVar2);
      (sym->super_PTypeBase).super_DObject.Class = pPVar7;
    }
    pPVar1 = PField::RegistrationInfo.MyClass;
    bVar13 = pPVar7 != (PClass *)0x0;
    pPVar10 = pPVar7;
    if (pPVar7 != pPVar4 && bVar13) {
      do {
        pPVar10 = pPVar10->ParentClass;
        bVar13 = pPVar10 != (PClass *)0x0;
        if (pPVar10 == pPVar4) break;
      } while (pPVar10 != (PClass *)0x0);
    }
    if (bVar13) {
      this_00 = &(this->super_FxExpression).ScriptPosition;
      pcVar11 = "struct";
      if (bVar12) {
        pcVar11 = "class";
      }
      FScriptPosition::Message
                (this_00,8,"Resolving name \'%s\' as %s constant\n",
                 FName::NameData.NameArray[(this->Identifier).Index].Text,pcVar11);
      if (*object != (FxExpression *)0x0) {
        (*(*object)->_vptr_FxExpression[1])();
      }
      *object = (FxExpression *)0x0;
      pFVar6 = FxConstant::MakeConstant(sym,this_00);
      return pFVar6;
    }
    if (pPVar7 == (PClass *)0x0) {
      iVar2 = (**(sym->super_PTypeBase).super_DObject._vptr_DObject)(sym);
      pPVar7 = (PClass *)CONCAT44(extraout_var_02,iVar2);
      (sym->super_PTypeBase).super_DObject.Class = pPVar7;
    }
    pPVar10 = PFunction::RegistrationInfo.MyClass;
    bVar13 = pPVar7 != (PClass *)0x0;
    pPVar4 = pPVar7;
    if (pPVar7 != pPVar1 && bVar13) {
      do {
        pPVar4 = pPVar4->ParentClass;
        bVar13 = pPVar4 != (PClass *)0x0;
        if (pPVar4 == pPVar1) break;
      } while (pPVar4 != (PClass *)0x0);
    }
    if (bVar13) {
      uVar3 = *(uint *)&sym[1].super_PTypeBase.super_DObject.ObjNext;
      if (((char)uVar3 < '\0') && (ctx->FromDecorate == false)) {
        FScriptPosition::Message
                  (&(this->super_FxExpression).ScriptPosition,0,
                   "Accessing deprecated member variable %s",
                   FName::NameData.NameArray
                   [*(int *)&(sym->super_PTypeBase).super_DObject.field_0x24].Text);
        uVar3 = *(uint *)&sym[1].super_PTypeBase.super_DObject.ObjNext;
      }
      if (((uVar3 & 0x20) != 0) &&
         (local_40 != &(classctx->super_PNamedType).super_PCompoundType.super_PType.Symbols)) {
        FScriptPosition::Message
                  (&(this->super_FxExpression).ScriptPosition,2,"Private member %s not accessible",
                   FName::NameData.NameArray
                   [*(int *)&(sym->super_PTypeBase).super_DObject.field_0x24].Text);
        return (FxExpression *)0x0;
      }
      puVar8 = (undefined8 *)FMemArena::Alloc(&FxAlloc,0x40);
      pFVar6 = *object;
      *puVar8 = &PTR__FxExpression_0070d370;
      FScriptPosition::FScriptPosition
                ((FScriptPosition *)(puVar8 + 1),&(this->super_FxExpression).ScriptPosition);
      puVar8[3] = 0;
      *(undefined2 *)(puVar8 + 4) = 0x100;
      if (bVar12) {
        puVar8[5] = pFVar6;
        puVar8[6] = sym;
        *(undefined2 *)(puVar8 + 7) = 0x100;
        ppuVar9 = &PTR__FxStructMember_0070ddf8;
        *puVar8 = &PTR__FxStructMember_0070ddf8;
        *(undefined4 *)((long)puVar8 + 0x24) = 0x21;
      }
      else {
        *(undefined4 *)((long)puVar8 + 0x24) = 0x22;
        ppuVar9 = &PTR__FxStructMember_0070c930;
        *puVar8 = &PTR__FxStructMember_0070c930;
        puVar8[5] = pFVar6;
        puVar8[6] = sym;
        *(undefined2 *)(puVar8 + 7) = 0x100;
      }
      *object = (FxExpression *)0x0;
      pFVar6 = (FxExpression *)(*(code *)ppuVar9[2])(puVar8,ctx);
      return pFVar6;
    }
    if (pPVar7 == (PClass *)0x0) {
      iVar2 = (**(sym->super_PTypeBase).super_DObject._vptr_DObject)(sym);
      pPVar7 = (PClass *)CONCAT44(extraout_var_03,iVar2);
      (sym->super_PTypeBase).super_DObject.Class = pPVar7;
    }
    bVar12 = pPVar7 != (PClass *)0x0;
    if (pPVar7 != pPVar10 && bVar12) {
      do {
        pPVar7 = pPVar7->ParentClass;
        bVar12 = pPVar7 != (PClass *)0x0;
        if (pPVar7 == pPVar10) break;
      } while (pPVar7 != (PClass *)0x0);
    }
    pcVar11 = FName::NameData.NameArray[(this->Identifier).Index].Text;
    message = "Invalid member identifier \'%s\'.\n";
    if (bVar12) {
      message = "Function \'%s\' used without ().\n";
    }
  }
  FScriptPosition::Message(&(this->super_FxExpression).ScriptPosition,2,message,pcVar11);
  if (*object != (FxExpression *)0x0) {
    (*(*object)->_vptr_FxExpression[1])();
  }
  *object = (FxExpression *)0x0;
  return (FxExpression *)0x0;
}

Assistant:

FxExpression *FxIdentifier::ResolveMember(FCompileContext &ctx, PStruct *classctx, FxExpression *&object, PStruct *objtype)
{
	PSymbol *sym;
	PSymbolTable *symtbl;
	bool isclass = objtype->IsKindOf(RUNTIME_CLASS(PClass));

	if (Identifier == NAME_Default)
	{
		if (!objtype->IsKindOf(RUNTIME_CLASS(PClassActor)))
		{
			ScriptPosition.Message(MSG_ERROR, "'Default' requires an actor type.");
			delete this;
			return nullptr;
		}

		FxExpression * x = new FxClassDefaults(object, ScriptPosition);
		object = nullptr;
		delete this;
		return x->Resolve(ctx);
	}

	if ((sym = objtype->Symbols.FindSymbolInTable(Identifier, symtbl)) != nullptr)
	{
		if (sym->IsKindOf(RUNTIME_CLASS(PSymbolConst)))
		{
			ScriptPosition.Message(MSG_DEBUGLOG, "Resolving name '%s' as %s constant\n", Identifier.GetChars(), isclass ? "class" : "struct");
			delete object;
			object = nullptr;
			return FxConstant::MakeConstant(sym, ScriptPosition);
		}
		else if (sym->IsKindOf(RUNTIME_CLASS(PField)))
		{
			PField *vsym = static_cast<PField*>(sym);

			// We have 4 cases to consider here:
			// 1. The symbol is a static/meta member (not implemented yet) which is always accessible.
			// 2. This is a static function 
			// 3. This is an action function with a restricted self pointer
			// 4. This is a normal member or unrestricted action function.
			if (vsym->Flags & VARF_Deprecated && !ctx.FromDecorate)
			{
				ScriptPosition.Message(MSG_WARNING, "Accessing deprecated member variable %s", vsym->SymbolName.GetChars());
			}
			if ((vsym->Flags & VARF_Private) && symtbl != &classctx->Symbols)
			{
				ScriptPosition.Message(MSG_ERROR, "Private member %s not accessible", vsym->SymbolName.GetChars());
				return nullptr;
			}

			auto x = isclass ? new FxClassMember(object, vsym, ScriptPosition) : new FxStructMember(object, vsym, ScriptPosition);
			object = nullptr;
			return x->Resolve(ctx);
		}
		else
		{
			if (sym->IsKindOf(RUNTIME_CLASS(PFunction)))
			{
				ScriptPosition.Message(MSG_ERROR, "Function '%s' used without ().\n", Identifier.GetChars());
			}
			else
			{
				ScriptPosition.Message(MSG_ERROR, "Invalid member identifier '%s'.\n", Identifier.GetChars());
			}
			delete object;
			object = nullptr;
			return nullptr;
		}
	}
	else
	{
		ScriptPosition.Message(MSG_ERROR, "Unknown identifier '%s'", Identifier.GetChars());
		delete object;
		object = nullptr;
		return nullptr;
	}
}